

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Typedef.cpp
# Opt level: O3

void __thiscall
psy::C::TypedefDeclarationSymbol::TypedefDeclarationSymbol
          (TypedefDeclarationSymbol *this,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope,TypedefNameType *tydefNameTy)

{
  TypeDeclarationImpl *p;
  
  p = (TypeDeclarationImpl *)operator_new(0x30);
  (p->super_DeclarationImpl).super_SymbolImpl.containingSym_ = containingSym;
  (p->super_DeclarationImpl).tree_ = tree;
  (p->super_DeclarationImpl).enclosingScope_ = enclosingScope;
  (p->super_DeclarationImpl).denotedTy_ = (Type *)0x0;
  *(undefined2 *)&(p->super_DeclarationImpl).super_SymbolImpl.field_1 = 0x307;
  p->ty_ = &tydefNameTy->super_Type;
  TypeDeclarationSymbol::TypeDeclarationSymbol(&this->super_TypeDeclarationSymbol,p);
  (this->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__TypeDeclarationSymbol_00520790;
  this->synonymizedTy_ = (Type *)0x0;
  TypedefNameType::setDeclaration(tydefNameTy,this);
  return;
}

Assistant:

TypedefDeclarationSymbol::TypedefDeclarationSymbol(const Symbol* containingSym,
                 const SyntaxTree* tree,
                 const Scope* enclosingScope,
                 TypedefNameType* tydefNameTy)
    : TypeDeclarationSymbol(
          new TypeDeclarationImpl(SymbolKind::TypedefDeclaration,
                                  containingSym,
                                  tree,
                                  enclosingScope,
                                  NameSpace::OrdinaryIdentifiers,
                                  tydefNameTy))
    , synonymizedTy_(nullptr)
{
    tydefNameTy->setDeclaration(this);
}